

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Socket> * __thiscall asl::Array<asl::Socket>::resize(Array<asl::Socket> *this,int m)

{
  int iVar1;
  
  iVar1 = *(int *)&this->_a[-2].super_SmartObject._p;
  reserve(this,m);
  if (iVar1 < m) {
    asl_construct<asl::Socket>(this->_a + iVar1,m - iVar1);
  }
  else if (m < iVar1) {
    asl_destroy<asl::Socket>(this->_a + m,iVar1 - m);
  }
  *(int *)&this->_a[-2].super_SmartObject._p = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}